

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
Shell::assertAction(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertAction *assn)

{
  ActionAssertionType AVar1;
  add_pointer_t<Shell::TrapResult> ptVar2;
  add_pointer_t<Shell::HostLimitResult> ptVar3;
  add_pointer_t<Shell::ExceptionResult> ptVar4;
  ostream *poVar5;
  Err local_240;
  string local_220;
  Ok local_1fe;
  Ok local_1fd;
  undefined4 local_1fc;
  Ok local_1f5 [13];
  undefined1 local_1e8 [8];
  ActionResult result;
  stringstream err;
  ostream local_198 [376];
  AssertAction *local_20;
  AssertAction *assn_local;
  Shell *this_local;
  
  local_20 = assn;
  assn_local = (AssertAction *)this;
  this_local = (Shell *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             ((long)&result.
                     super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
             + 0x38));
  doAction((ActionResult *)local_1e8,this,&local_20->action);
  AVar1 = local_20->type;
  if (AVar1 == Trap) {
    ptVar2 = std::
             get_if<Shell::TrapResult,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                       ((variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         *)local_1e8);
    if (ptVar2 != (add_pointer_t<Shell::TrapResult>)0x0) {
      ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,local_1f5);
      goto LAB_001e4716;
    }
    std::operator<<(local_198,"expected trap");
  }
  else if (AVar1 == Exhaustion) {
    ptVar3 = std::
             get_if<Shell::HostLimitResult,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                       ((variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         *)local_1e8);
    if (ptVar3 != (add_pointer_t<Shell::HostLimitResult>)0x0) {
      ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1fd);
      goto LAB_001e4716;
    }
    std::operator<<(local_198,"expected exhaustion");
  }
  else if (AVar1 == Exception) {
    ptVar4 = std::
             get_if<Shell::ExceptionResult,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                       ((variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         *)local_1e8);
    if (ptVar4 != (add_pointer_t<Shell::ExceptionResult>)0x0) {
      ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1fe);
      goto LAB_001e4716;
    }
    std::operator<<(local_198,"expected exception");
  }
  poVar5 = std::operator<<(local_198,", got ");
  resultToString_abi_cxx11_(&local_220,this,(ActionResult *)local_1e8);
  std::operator<<(poVar5,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::stringstream::str();
  ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_240);
  ::wasm::Err::~Err(&local_240);
LAB_001e4716:
  local_1fc = 1;
  std::variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>::
  ~variant((variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
            *)local_1e8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             ((long)&result.
                     super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
             + 0x38));
  return __return_storage_ptr__;
}

Assistant:

Result<> assertAction(AssertAction& assn) {
    std::stringstream err;
    auto result = doAction(assn.action);
    switch (assn.type) {
      case ActionAssertionType::Trap:
        if (std::get_if<TrapResult>(&result)) {
          return Ok{};
        }
        err << "expected trap";
        break;
      case ActionAssertionType::Exhaustion:
        if (std::get_if<HostLimitResult>(&result)) {
          return Ok{};
        }
        err << "expected exhaustion";
        break;
      case ActionAssertionType::Exception:
        if (std::get_if<ExceptionResult>(&result)) {
          return Ok{};
        }
        err << "expected exception";
        break;
    }
    err << ", got " << resultToString(result);
    return Err{err.str()};
  }